

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

void __thiscall smf::MidiFile::~MidiFile(MidiFile *this)

{
  MidiEventList *this_00;
  pointer p_Var1;
  
  (this->m_readFileName)._M_string_length = 0;
  *(this->m_readFileName)._M_dataplus._M_p = '\0';
  clear(this);
  this_00 = *(this->m_events).
             super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  if (this_00 != (MidiEventList *)0x0) {
    MidiEventList::~MidiEventList(this_00);
    operator_delete(this_00);
    *(this->m_events).
     super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
     super__Vector_impl_data._M_start = (MidiEventList *)0x0;
  }
  std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
            (&this->m_events,0);
  this->m_rwstatus = false;
  p_Var1 = (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>._M_impl.
      super__Vector_impl_data._M_finish != p_Var1) {
    (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>._M_impl.
    super__Vector_impl_data._M_finish = p_Var1;
  }
  this->m_timemapvalid = false;
  std::_Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>::~_Vector_base
            (&(this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>)
  ;
  std::__cxx11::string::~string((string *)&this->m_readFileName);
  std::_Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::~_Vector_base
            ((_Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_> *)this);
  return;
}

Assistant:

MidiFile::~MidiFile() {
	m_readFileName.clear();
	clear();
	if (m_events[0] != NULL) {
		delete m_events[0];
		m_events[0] = NULL;
	}
	m_events.resize(0);
	m_rwstatus = false;
	m_timemap.clear();
	m_timemapvalid = 0;
}